

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaUtils.cpp
# Opt level: O1

bool nv::cuda::isHardwarePresent(void)

{
  return false;
}

Assistant:

bool nv::cuda::isHardwarePresent()
{
#if defined HAVE_CUDA
	// Make sure that CUDA driver matches CUDA runtime.
	if (!isCudaDriverAvailable(CUDART_VERSION))
	{
		nvDebug("CUDA driver not available for CUDA runtime %d\n", CUDART_VERSION);
		return false;
	}

	int count = deviceCount();
	if (count == 1)
	{
		// Make sure it's not an emulation device.
		cudaDeviceProp deviceProp;
		cudaGetDeviceProperties(&deviceProp, 0);

		// deviceProp.name != Device Emulation (CPU)
		if (deviceProp.major == -1 || deviceProp.minor == -1)
		{
			return false;
		}
	}

	// @@ Make sure that warp size == 32

	// @@ Make sure available GPU is faster than the CPU.

	return count > 0;
#else
	return false;
#endif
}